

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmElementSegment.cpp
# Opt level: O2

void __thiscall Wasm::WasmElementSegment::Init(WasmElementSegment *this)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  undefined4 *puVar4;
  uint *__s;
  
  uVar3 = this->m_numElem;
  if (uVar3 == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/WasmReader/WasmElementSegment.cpp"
                       ,0x18,"(m_numElem > 0)","m_numElem > 0");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
    uVar3 = this->m_numElem;
  }
  __s = Memory::AllocateArray<Memory::ArenaAllocator,unsigned_int,false>
                  ((Memory *)this->m_alloc,(ArenaAllocator *)Memory::ArenaAllocator::Alloc,0,
                   (ulong)uVar3);
  this->m_elems = __s;
  memset(__s,0xff,(ulong)this->m_numElem << 2);
  return;
}

Assistant:

void WasmElementSegment::Init()
    {
        Assert(m_numElem > 0);
        m_elems = AnewArray(m_alloc, uint32, m_numElem);
        memset(m_elems, Js::Constants::UninitializedValue, m_numElem * sizeof(uint32));
    }